

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDG2Dot.h
# Opt level: O3

void __thiscall dg::debug::LLVMDGDumpBlocks::dumpBlock(LLVMDGDumpBlocks *this,LLVMBBlock *blk)

{
  ostream *poVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ofstream *poVar5;
  char *pcVar6;
  uint uVar7;
  long *plVar8;
  string str;
  raw_os_ostream ro;
  ostringstream ostr;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  code *local_1e0;
  undefined4 local_1d8;
  long local_1d0;
  undefined8 uStack_1c8;
  long local_1c0;
  undefined1 local_1b8;
  undefined8 local_1b0;
  undefined4 local_1a8;
  ostringstream *local_1a0;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  poVar5 = &(this->super_DG2Dot<dg::LLVMNode>).out;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"NODE",4);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," [label=\"",9);
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1d8 = 0;
  local_1b8 = 0;
  local_1b0 = 0;
  local_1a8 = 1;
  local_1d0 = 0;
  uStack_1c8 = 0;
  local_1c0 = 0;
  local_1e0 = std::filebuf::~filebuf;
  local_1a0 = local_198;
  llvm::Value::print((raw_ostream *)blk->key,SUB81(&local_1e0,0));
  if (local_1c0 != local_1d0) {
    llvm::raw_ostream::flush_nonempty();
  }
  std::__cxx11::stringbuf::str();
  if ((char)*local_200 != '\0') {
    uVar2 = 1;
    uVar3 = 0;
    uVar7 = 0;
    plVar8 = local_200;
    do {
      if (uVar7 < 0x28) {
        uVar7 = uVar7 + 1;
      }
      else {
        *(undefined1 *)plVar8 = 10;
        uVar7 = 0;
      }
      if (*(char *)((long)local_200 + uVar3) == '\n') {
        uVar7 = 0;
      }
      uVar3 = (ulong)uVar2;
      plVar8 = (long *)((long)local_200 + uVar3);
      uVar2 = uVar2 + 1;
    } while (*(char *)((long)local_200 + uVar3) != '\0');
  }
  if ((int)blk->slice_id == 0) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar5,(char *)local_200,local_1f8);
    pcVar6 = "\"";
    lVar4 = 1;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\\nslice: ",9);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\\n",2);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar5,(char *)local_200,local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
    pcVar6 = "style=filled fillcolor=greenyellow";
    lVar4 = 0x22;
    poVar1 = (ostream *)poVar5;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar6,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"]\n",2);
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  llvm::raw_os_ostream::~raw_os_ostream((raw_os_ostream *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void dumpBlock(LLVMBBlock *blk) {
        out << "NODE" << blk << " [label=\"";

        std::ostringstream ostr;
        llvm::raw_os_ostream ro(ostr);

        ro << *blk->getKey();
        ro.flush();
        std::string str = ostr.str();

        unsigned int i = 0;
        unsigned int len = 0;
        while (str[i] != 0) {
            if (len >= 40) {
                str[i] = '\n';
                len = 0;
            } else
                ++len;

            if (str[i] == '\n')
                len = 0;

            ++i;
        }

        unsigned int slice_id = blk->getSlice();
        if (slice_id != 0)
            out << "\\nslice: " << slice_id << "\\n";
        out << str << "\"";

        if (slice_id != 0)
            out << "style=filled fillcolor=greenyellow";

        out << "]\n";
    }